

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CoverWriteFile(Min_Cube_t *pCover,char *pName,int fEsop)

{
  bool bVar1;
  uint uVar2;
  Min_Cube_t *pCube;
  size_t sVar3;
  long lVar4;
  long lVar5;
  FILE *__stream;
  char *pcVar6;
  Min_Cube_t *pMVar7;
  char *pcVar8;
  int Count;
  char Buffer [1000];
  undefined8 uStack_420;
  char acStack_418 [1000];
  
  pcVar8 = "esop";
  if (fEsop == 0) {
    pcVar8 = "pla";
  }
  uStack_420 = 0x44ec28;
  sprintf(acStack_418,"%s.%s",pName,pcVar8);
  uStack_420 = 0x44ec30;
  sVar3 = strlen(acStack_418);
  uVar2 = (int)sVar3 - 1;
  if (-1 < (int)uVar2) {
    lVar4 = (ulong)uVar2 + 1;
    do {
      if ((byte)(acStack_418[lVar4 + -1] | 2U) == 0x3e) {
        acStack_418[lVar4 + -1] = '_';
      }
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  uStack_420 = 0x44ec5f;
  __stream = fopen(acStack_418,"w");
  pcVar8 = "ESOP";
  if (fEsop == 0) {
    pcVar8 = "SOP";
  }
  uVar2 = 0;
  uStack_420 = 0x44ec80;
  pcVar6 = Extra_TimeStamp();
  uStack_420 = 0x44ec9a;
  fprintf(__stream,"# %s cover for output %s generated by ABC on %s\n",pcVar8,pName,pcVar6);
  if (pCover == (Min_Cube_t *)0x0) {
    uVar2 = 0;
    uStack_420 = 0x44ecf4;
    fprintf(__stream,".i %d\n",0);
    uStack_420 = 0x44ed0a;
    fprintf(__stream,".o %d\n",1);
  }
  else {
    uStack_420 = 0x44ecb8;
    fprintf(__stream,".i %d\n",(ulong)(*(uint *)&pCover->field_0x8 & 0x3ff));
    uStack_420 = 0x44ecce;
    fprintf(__stream,".o %d\n",1);
    pMVar7 = pCover;
    do {
      uVar2 = uVar2 + 1;
      pMVar7 = pMVar7->pNext;
    } while (pMVar7 != (Min_Cube_t *)0x0);
  }
  uStack_420 = 0x44ed1e;
  fprintf(__stream,".p %d\n",(ulong)uVar2);
  if (fEsop != 0) {
    uStack_420 = 0x44ed3b;
    fwrite(".type esop\n",0xb,1,__stream);
  }
  for (; pCover != (Min_Cube_t *)0x0; pCover = pCover->pNext) {
    uStack_420 = 0x44ed48;
    Min_CubeWrite((FILE *)__stream,pCover);
  }
  uStack_420 = 0x44ed69;
  fwrite(".e\n",3,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Min_CoverWriteFile( Min_Cube_t * pCover, char * pName, int fEsop )
{
    char Buffer[1000];
    Min_Cube_t * pCube;
    FILE * pFile;
    int i;
    sprintf( Buffer, "%s.%s", pName, fEsop? "esop" : "pla" );
    for ( i = strlen(Buffer) - 1; i >= 0; i-- )
        if ( Buffer[i] == '<' || Buffer[i] == '>' )
            Buffer[i] = '_';
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# %s cover for output %s generated by ABC on %s\n", fEsop? "ESOP":"SOP", pName, Extra_TimeStamp() );
    fprintf( pFile, ".i %d\n", pCover? pCover->nVars : 0 );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".p %d\n", Min_CoverCountCubes(pCover) );
    if ( fEsop ) fprintf( pFile, ".type esop\n" );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeWrite( pFile, pCube );
    fprintf( pFile, ".e\n" );
    fclose( pFile );
}